

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modify_maximal_reconvergence.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ModifyMaximalReconvergence::RemoveMaximalReconvergence
          (ModifyMaximalReconvergence *this)

{
  bool bVar1;
  uint32_t uVar2;
  Instruction *this_00;
  byte bVar3;
  uint uVar4;
  IRContext *this_01;
  
  this_01 = (this->super_Pass).context_;
  this_00 = *(Instruction **)
             ((long)&(((this_01->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  bVar3 = 0;
  if (this_00 != (Instruction *)0x0) {
    do {
      if ((this_00->opcode_ != OpExecutionModeId) && (this_00->opcode_ != OpExecutionMode)) break;
      uVar4 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar4 = (uint)this_00->has_result_id_;
      }
      uVar2 = Instruction::GetSingleWordOperand(this_00,uVar4 + 1);
      if (uVar2 == 0x1787) {
        this_00 = IRContext::KillInst((this->super_Pass).context_,this_00);
        bVar3 = 1;
      }
      else {
        this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if ((this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)
        break;
      }
    } while (this_00 != (Instruction *)0x0);
    this_01 = (this->super_Pass).context_;
  }
  bVar1 = IRContext::RemoveExtension(this_01,kSPV_KHR_maximal_reconvergence);
  return (bool)(bVar1 | bVar3);
}

Assistant:

bool ModifyMaximalReconvergence::RemoveMaximalReconvergence() {
  bool changed = false;
  std::vector<Instruction*> to_remove;
  Instruction* mode = &*get_module()->execution_mode_begin();
  while (mode) {
    if (mode->opcode() != spv::Op::OpExecutionMode &&
        mode->opcode() != spv::Op::OpExecutionModeId) {
      break;
    }
    if (spv::ExecutionMode(mode->GetSingleWordInOperand(1)) ==
        spv::ExecutionMode::MaximallyReconvergesKHR) {
      mode = context()->KillInst(mode);
      changed = true;
    } else {
      mode = mode->NextNode();
    }
  }

  changed |=
      context()->RemoveExtension(Extension::kSPV_KHR_maximal_reconvergence);
  return changed;
}